

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMeshEffect.cpp
# Opt level: O2

void __thiscall dgMeshEffect::SphericalMapping(dgMeshEffect *this,HaI32 material)

{
  undefined1 auVar1 [16];
  dgBigVector *pdVar2;
  dgVertexAtribute *pdVar3;
  long lVar4;
  dgTreeNode *pdVar5;
  HaI32 i;
  long lVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  dgStack<dgMeshEffect::dgVertexAtribute> attribArray;
  double dStack_c8;
  double dStack_c0;
  undefined1 local_b8 [16];
  double dStack_a8;
  double dStack_a0;
  double local_90;
  dgStack<dgBigVector> sphere;
  dgTemplateVector<double> local_78;
  dgBigVector origin;
  
  GetOrigin(&origin,this);
  dgStack<dgBigVector>::dgStack(&sphere,*(HaI32 *)&(this->super_dgRefCounter).field_0xc);
  lVar4 = 0x18;
  for (lVar6 = 0; lVar6 < *(int *)&(this->super_dgRefCounter).field_0xc; lVar6 = lVar6 + 1) {
    pdVar2 = this->m_points;
    dStack_a0 = *(double *)((long)&(pdVar2->super_dgTemplateVector<double>).m_x + lVar4);
    local_b8 = vsubpd_avx(*(undefined1 (*) [16])((long)pdVar2 + lVar4 + -0x18),
                          (undefined1  [16])origin.super_dgTemplateVector<double>._0_16_);
    dStack_a8 = *(double *)((long)pdVar2 + lVar4 + -8) - origin.super_dgTemplateVector<double>.m_z;
    dgBigVector::dgBigVector((dgBigVector *)&attribArray,(dgTemplateVector<double> *)local_b8);
    auVar1._8_8_ = attribArray._8_8_;
    auVar1._0_8_ = attribArray.super_dgStackBase.m_ptr;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = dStack_c8;
    auVar10._0_8_ =
         (double)attribArray.super_dgStackBase.m_ptr * (double)attribArray.super_dgStackBase.m_ptr;
    auVar10._8_8_ = (double)attribArray._8_8_ * (double)attribArray._8_8_;
    auVar10 = vshufpd_avx(auVar10,auVar10,1);
    auVar10 = vfmadd231sd_fma(auVar10,auVar1,auVar1);
    auVar10 = vfmadd231sd_fma(auVar10,auVar9,auVar9);
    auVar10 = vsqrtsd_avx(auVar10,auVar10);
    local_78.m_y = (double)(1.0 / (float)auVar10._0_8_);
    local_78.m_z = dStack_c8 * local_78.m_y;
    local_78.m_x = (double)attribArray.super_dgStackBase.m_ptr * local_78.m_y;
    local_78.m_y = (double)attribArray._8_8_ * local_78.m_y;
    local_78.m_w = dStack_c0;
    dgBigVector::dgBigVector((dgBigVector *)local_b8,&local_78);
    dVar8 = dStack_a8;
    attribArray.super_dgStackBase.m_ptr = (void *)local_b8._0_8_;
    attribArray._8_8_ = local_b8._8_8_;
    dStack_c8 = dStack_a8;
    dStack_c0 = dStack_a0;
    dVar7 = asin((double)local_b8._8_8_);
    dVar8 = atan2((double)attribArray.super_dgStackBase.m_ptr,dVar8);
    local_90 = (3.1415998935699463 - (double)(float)dVar8) / 6.283199787139893;
    pdVar2 = dgStack<dgBigVector>::operator[](&sphere,(HaI32)lVar6);
    (pdVar2->super_dgTemplateVector<double>).m_x = local_90;
    pdVar2 = dgStack<dgBigVector>::operator[](&sphere,(HaI32)lVar6);
    lVar4 = lVar4 + 0x20;
    (pdVar2->super_dgTemplateVector<double>).m_y =
         (1.5707999467849731 - (double)(float)dVar7) / 3.1415998935699463;
  }
  dgStack<dgMeshEffect::dgVertexAtribute>::dgStack
            (&attribArray,(this->super_dgPolyhedra).super_dgTree<dgEdge,_long>.m_count);
  pdVar3 = dgStack<dgMeshEffect::dgVertexAtribute>::operator[](&attribArray,0);
  EnumerateAttributeArray(this,pdVar3);
  local_b8._8_8_ = this;
  local_b8._0_8_ = dgTree<dgEdge,_long>::Minimum((dgTree<dgEdge,_long> *)this);
  pdVar5 = (dgTreeNode *)local_b8._0_8_;
  while (pdVar5 != (dgTreeNode *)0x0) {
    pdVar3 = dgStack<dgMeshEffect::dgVertexAtribute>::operator[]
                       (&attribArray,(HaI32)(pdVar5->m_info).m_userData);
    pdVar2 = dgStack<dgBigVector>::operator[](&sphere,(pdVar5->m_info).m_incidentVertex);
    pdVar3->m_u0 = (HaF64)(pdVar2->super_dgTemplateVector<double>).m_x;
    pdVar2 = dgStack<dgBigVector>::operator[](&sphere,(pdVar5->m_info).m_incidentVertex);
    pdVar3->m_v0 = (HaF64)(pdVar2->super_dgTemplateVector<double>).m_y;
    pdVar2 = dgStack<dgBigVector>::operator[](&sphere,(pdVar5->m_info).m_incidentVertex);
    pdVar3->m_u1 = (HaF64)(pdVar2->super_dgTemplateVector<double>).m_x;
    pdVar2 = dgStack<dgBigVector>::operator[](&sphere,(pdVar5->m_info).m_incidentVertex);
    pdVar3->m_v1 = (HaF64)(pdVar2->super_dgTemplateVector<double>).m_y;
    pdVar3->m_material = (HaF64)(double)material;
    dgTree<dgEdge,_long>::Iterator::operator++((Iterator *)local_b8,0);
    pdVar5 = (dgTreeNode *)local_b8._0_8_;
  }
  pdVar3 = dgStack<dgMeshEffect::dgVertexAtribute>::operator[](&attribArray,0);
  FixCylindricalMapping(this,pdVar3);
  pdVar3 = dgStack<dgMeshEffect::dgVertexAtribute>::operator[](&attribArray,0);
  ApplyAttributeArray(this,pdVar3);
  free(attribArray.super_dgStackBase.m_ptr);
  free(sphere.super_dgStackBase.m_ptr);
  return;
}

Assistant:

void dgMeshEffect::SphericalMapping (hacd::HaI32 material)
{
	dgBigVector origin (GetOrigin());

	dgStack<dgBigVector>sphere (m_pointCount);
	for (hacd::HaI32 i = 0; i < m_pointCount; i ++) {
		dgBigVector point (m_points[i] - origin);
		point = point.Scale (1.0f / dgSqrt (point % point));

		hacd::HaF64 u = dgAsin (point.m_y);
		hacd::HaF64 v = dgAtan2 (point.m_x, point.m_z);

		u = (hacd::HaF64 (3.1416f/2.0f) - u) / hacd::HaF64 (3.1416f);
		v = (hacd::HaF64 (3.1416f) - v) / hacd::HaF64 (2.0f * 3.1416f);
		sphere[i].m_x = v;
		sphere[i].m_y = u;
	}


	dgStack<dgVertexAtribute>attribArray (GetCount());
	EnumerateAttributeArray (&attribArray[0]);

	dgPolyhedra::Iterator iter (*this);	
	for(iter.Begin(); iter; iter ++){
		dgEdge* const edge = &(*iter);
		dgVertexAtribute& attrib = attribArray[hacd::HaI32 (edge->m_userData)];
		attrib.m_u0 = sphere[edge->m_incidentVertex].m_x;
		attrib.m_v0 = sphere[edge->m_incidentVertex].m_y;
		attrib.m_u1 = sphere[edge->m_incidentVertex].m_x;
		attrib.m_v1 = sphere[edge->m_incidentVertex].m_y;
		attrib.m_material = material;
	}

	FixCylindricalMapping (&attribArray[0]);
	ApplyAttributeArray (&attribArray[0]);
}